

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceBase::iterate
          (TestStatus *__return_storage_ptr__,MemoryQualifierInstanceBase *this)

{
  ImageType IVar1;
  TestLog *log;
  MemoryQualifierInstanceBase *pMVar2;
  bool bVar3;
  int i_2;
  deUint32 dVar4;
  deUint32 dVar5;
  int iVar6;
  VkFormat VVar7;
  VkDevice device;
  DeviceInterface *deviceInterface;
  const_iterator cVar8;
  TextureFormat *pTVar9;
  undefined8 *puVar10;
  long *plVar11;
  int i;
  long lVar12;
  TextureFormat TVar13;
  uint uVar14;
  int x;
  ulong uVar15;
  TestStatus *pTVar16;
  uint y;
  ulong uVar17;
  ulong *puVar18;
  uint x_00;
  int iVar19;
  UVec3 computeGridSize_1;
  UVec3 computeGridSize_3;
  UVec3 computeGridSize_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  UVec3 numGroups;
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  ConstPixelBufferAccess referencePixelBuffer;
  UVec3 computeGridSize;
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  UVec3 computeGridSize_2;
  TextureLevel referenceImage;
  ConstPixelBufferAccess resultPixelBuffer;
  Vec4 local_438;
  ulong local_428;
  long lStack_420;
  undefined1 local_410 [12];
  ChannelType CStack_404;
  long local_400;
  TextureFormat TStack_3f8;
  VkQueue local_3e8;
  ulong *local_3e0;
  long local_3d8;
  ulong local_3d0;
  undefined8 uStack_3c8;
  UVec3 *local_3c0;
  MemoryQualifierInstanceBase *local_3b8;
  TestContext *local_3b0;
  undefined8 local_3a8;
  TextureFormat local_3a0;
  TextureFormat local_398 [2];
  undefined1 local_388 [16];
  long local_378;
  TextureFormat TStack_370;
  ChannelOrder local_364;
  ChannelType local_360;
  ChannelOrder local_35c;
  ulong *local_358;
  long local_350;
  ulong local_348 [2];
  ulong local_338;
  uint local_330;
  TextureFormat local_328;
  long *plStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  ConstPixelBufferAccess local_300;
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8 [2];
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8 [2];
  TestStatus *local_298;
  int local_28c;
  int local_288;
  int local_284;
  TextureFormat *local_280;
  TextureFormat local_278;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_270;
  TextureFormat local_258;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_250;
  TextureFormat local_238;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_230;
  TextureFormat local_218;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_210;
  ConstPixelBufferAccess local_1f8 [2];
  ios_base local_188 [264];
  TextureLevel local_80;
  ConstPixelBufferAccess local_58;
  
  local_298 = __return_storage_ptr__;
  device = Context::getDevice((this->super_TestInstance).m_context);
  deviceInterface = Context::getDeviceInterface((this->super_TestInstance).m_context);
  local_3e8 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar4 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_3c0 = &this->m_imageSize;
  dVar5 = getNumPixels(this->m_imageType,local_3c0);
  iVar6 = tcu::getPixelSize(this->m_format);
  uVar15 = (ulong)(iVar6 * dVar5);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(this,uVar15);
  (*(this->super_TestInstance)._vptr_TestInstance[4])(this);
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)((this->super_TestInstance).m_context)->m_progCollection,&this->m_name);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_1f8,deviceInterface,device,
             *(ProgramBinary **)(cVar8._M_node + 2),0);
  local_218 = local_1f8[0].m_format;
  local_3b8 = this;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)local_1f8,deviceInterface,device,
                     (VkDescriptorSetLayout)
                     (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                     m_data.object.m_internal);
  local_278 = local_1f8[0].m_format;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)local_1f8,deviceInterface,device,
                      (VkPipelineLayout)local_1f8[0].m_format,(VkShaderModule)local_218);
  local_238 = local_1f8[0].m_format;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_1f8,deviceInterface,device,2,dVar4,
             (VkAllocationCallbacks *)0x0);
  local_258 = local_1f8[0].m_format;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_1f8,deviceInterface,device,
             (VkCommandPool)local_1f8[0].m_format,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  pMVar2 = local_3b8;
  plStack_320 = (long *)CONCAT44(local_1f8[0].m_size.m_data[1],local_1f8[0].m_size.m_data[0]);
  local_318 = CONCAT44(local_1f8[0].m_pitch.m_data[0],local_1f8[0].m_size.m_data[2]);
  uStack_310 = CONCAT44(local_1f8[0].m_pitch.m_data[2],local_1f8[0].m_pitch.m_data[1]);
  local_328 = local_1f8[0].m_format;
  beginCommandBuffer(deviceInterface,(VkCommandBuffer)local_1f8[0].m_format);
  (*deviceInterface->_vptr_DeviceInterface[0x4c])(deviceInterface,local_328,1,local_238);
  (*deviceInterface->_vptr_DeviceInterface[0x56])
            (deviceInterface,local_328,1,local_278,0,1,&pMVar2->m_descriptorSet,0,0);
  (*(pMVar2->super_TestInstance)._vptr_TestInstance[5])(pMVar2,local_328,uVar15);
  IVar1 = pMVar2->m_imageType;
  getShaderGridSize((image *)local_410,IVar1,local_3c0);
  getShaderGridSize((image *)local_1f8,IVar1,local_3c0);
  local_300.m_format.order = local_1f8[0].m_format.order;
  if (RGB < local_1f8[0].m_format.order) {
    local_300.m_format.order = RGBA;
  }
  local_300.m_format.type = UNORM_SHORT_565;
  if (local_1f8[0].m_format.type < UNORM_SHORT_565) {
    local_300.m_format.type = local_1f8[0].m_format.type;
  }
  local_280 = &local_3b8->m_format;
  local_300.m_size.m_data[0] = 2;
  if ((uint)local_1f8[0].m_size.m_data[0] < 2) {
    local_300.m_size.m_data[0] = local_1f8[0].m_size.m_data[0];
  }
  local_338 = 0;
  local_330 = 0;
  lVar12 = 0;
  do {
    *(uint *)((long)&local_338 + lVar12 * 4) =
         *(uint *)(local_410 + lVar12 * 4) / (uint)local_300.m_size.m_data[lVar12 + -2];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  (*deviceInterface->_vptr_DeviceInterface[0x5d])
            (deviceInterface,local_328,local_338 & 0xffffffff,local_338 >> 0x20,(ulong)local_330);
  (*(local_3b8->super_TestInstance)._vptr_TestInstance[6])(local_3b8,local_328,uVar15);
  endCommandBuffer(deviceInterface,(VkCommandBuffer)local_328);
  submitCommandsAndWait(deviceInterface,device,local_3e8,(VkCommandBuffer)local_328);
  pMVar2 = local_3b8;
  lVar12 = (long)(((local_3b8->m_buffer).
                   super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                   m_data.ptr)->m_allocation).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (deviceInterface,device,(VkDeviceMemory)*(deUint64 *)(lVar12 + 8),
             *(VkDeviceSize *)(lVar12 + 0x10),uVar15);
  getShaderGridSize((image *)&local_28c,pMVar2->m_imageType,local_3c0);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_58,local_280,local_28c,local_288,local_284,*(void **)(lVar12 + 0x18));
  getShaderGridSize((image *)&local_3a8,local_3b8->m_imageType,local_3c0);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)local_1f8,local_280,(int)local_3a8,local_3a8._4_4_,local_3a0.order);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_410,(TextureLevel *)local_1f8);
  tcu::TextureLevel::TextureLevel
            (&local_80,local_280,(int)local_3a8,local_3a8._4_4_,local_3a0.order);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_300,&local_80);
  if (0 < (int)local_400) {
    uVar14 = 0;
    do {
      if (0 < (int)CStack_404) {
        y = 0;
        do {
          if (0 < (int)local_410._8_4_) {
            x_00 = 0;
            do {
              lVar12 = 0;
              do {
                *(uint *)(local_388 + lVar12 * 4) = y ^ uVar14 ^ x_00;
                lVar12 = lVar12 + 1;
              } while (lVar12 != 4);
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)local_410,(IVec4 *)local_388,x_00,y,uVar14);
              x_00 = x_00 + 1;
            } while ((int)x_00 < (int)local_410._8_4_);
          }
          y = y + 1;
        } while ((int)y < (int)CStack_404);
      }
      uVar14 = uVar14 + 1;
    } while ((int)uVar14 < (int)local_400);
  }
  getShaderGridSize((image *)local_388,local_3b8->m_imageType,local_3c0);
  local_35c = local_388._0_4_;
  if (RGB < (uint)local_388._0_4_) {
    local_35c = RGBA;
  }
  local_360 = UNORM_SHORT_565;
  if ((uint)local_388._4_4_ < UNORM_SHORT_565) {
    local_360 = local_388._4_4_;
  }
  local_364 = I;
  if ((uint)local_388._8_4_ < I) {
    local_364 = local_388._8_4_;
  }
  if (0 < local_300.m_size.m_data[2]) {
    local_3b0 = (TestContext *)0x0;
    do {
      if (0 < local_300.m_size.m_data[1]) {
        local_3e8 = (VkQueue)((ulong)local_3e8 & 0xffffffff00000000);
        do {
          if (0 < local_300.m_size.m_data[0]) {
            uVar15 = 0;
            iVar6 = (uint)local_3e8 - (uint)local_3e8 % local_360;
            do {
              x = (int)uVar15;
              uVar17 = (ulong)local_35c;
              lVar12 = 0;
              iVar19 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_388,(int)local_410,
                           (uint)(*(int *)((long)&image::(anonymous_namespace)::g_ShaderReadOffsetsX
                                          + lVar12) + x) % local_35c + (x - (int)(uVar15 % uVar17)),
                           (*(int *)((long)&image::(anonymous_namespace)::g_ShaderReadOffsetsY +
                                    lVar12) + (uint)local_3e8) % local_360 + iVar6);
                iVar19 = iVar19 + local_388._0_4_;
                lVar12 = lVar12 + 4;
              } while (lVar12 != 0x10);
              lVar12 = 0;
              do {
                *(int *)(local_388 + lVar12 * 4) = iVar19;
                lVar12 = lVar12 + 1;
              } while (lVar12 != 4);
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&local_300,(IVec4 *)local_388,x,(uint)local_3e8,
                         (int)local_3b0);
              uVar15 = (ulong)(x + 1U);
            } while ((int)(x + 1U) < local_300.m_size.m_data[0]);
          }
          iVar6 = (uint)local_3e8 + 1;
          local_3e8 = (VkQueue)CONCAT44(local_3e8._4_4_,iVar6);
        } while (iVar6 < local_300.m_size.m_data[1]);
      }
      uVar14 = (int)local_3b0 + 1;
      local_3b0 = (TestContext *)(ulong)uVar14;
    } while ((int)uVar14 < local_300.m_size.m_data[2]);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_1f8);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1f8,&local_80);
  pTVar9 = local_280;
  local_300.m_format = local_1f8[0].m_format;
  local_300.m_size.m_data[2] = local_1f8[0].m_size.m_data[2];
  local_300.m_pitch.m_data[2] = local_1f8[0].m_pitch.m_data[2];
  local_300.m_data = local_1f8[0].m_data;
  local_3b0 = ((local_3b8->super_TestInstance).m_context)->m_testCtx;
  IVar1 = local_3b8->m_imageType;
  VVar7 = ::vk::mapTextureFormat(local_280);
  bVar3 = ::vk::isIntFormat(VVar7);
  local_3e8._0_1_ = true;
  if (!bVar3) {
    VVar7 = ::vk::mapTextureFormat(pTVar9);
    local_3e8._0_1_ = ::vk::isUintFormat(VVar7);
  }
  dVar4 = getNumLayers(IVar1,local_3c0);
  if (dVar4 == 0) {
    dVar4 = 0;
  }
  else {
    uVar15 = 0;
    dVar4 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
      std::ios_base::~ios_base(local_188);
      pTVar9 = (TextureFormat *)
               std::__cxx11::string::replace((ulong)local_410,0,(char *)0x0,0xae789d);
      local_388._0_8_ = &local_378;
      TVar13 = (TextureFormat)(pTVar9 + 2);
      if (*pTVar9 == TVar13) {
        local_378 = *(long *)TVar13;
        TStack_370 = pTVar9[3];
      }
      else {
        local_378 = *(long *)TVar13;
        local_388._0_8_ = *pTVar9;
      }
      local_388._8_8_ = pTVar9[1];
      *pTVar9 = TVar13;
      pTVar9[1].order = R;
      pTVar9[1].type = SNORM_INT8;
      *(undefined1 *)&pTVar9[2].order = R;
      if ((long *)local_410._0_8_ != &local_400) {
        operator_delete((void *)local_410._0_8_,local_400 + 1);
      }
      local_3a8 = local_398;
      local_1f8[0].m_format.order = D;
      local_1f8[0].m_format.type = SNORM_INT8;
      local_3a8 = (TextureFormat *)std::__cxx11::string::_M_create(&local_3a8,(ulong)local_1f8);
      local_398[0] = local_1f8[0].m_format;
      local_3a8->order = 0x67616d49;
      local_3a8->type = 0x6f432065;
      local_3a8[1].order = 0x7261706d;
      local_3a8[1].type = 0x6e6f7369;
      *(undefined2 *)&local_3a8[2].order = 0x202c;
      local_3a0 = local_1f8[0].m_format;
      *(VkCommandBuffer_s *)((long)&local_3a8->order + (long)local_1f8[0].m_format) =
           (VkCommandBuffer_s)0x0;
      if (IVar1 - IMAGE_TYPE_CUBE < 2) {
        local_358 = local_348;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_358,local_3a8,
                   (VkCommandBuffer)((long)&local_3a8->order + (long)local_1f8[0].m_format));
        std::__cxx11::string::append((char *)&local_358);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
        std::ios_base::~ios_base(local_188);
        uVar17 = 0xf;
        if (local_358 != local_348) {
          uVar17 = local_348[0];
        }
        if (uVar17 < (ulong)(local_2b0 + local_350)) {
          uVar17 = 0xf;
          if (local_2b8 != local_2a8) {
            uVar17 = local_2a8[0];
          }
          if (uVar17 < (ulong)(local_2b0 + local_350)) goto LAB_00726d5e;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,(ulong)local_358);
        }
        else {
LAB_00726d5e:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_358,(ulong)local_2b8);
        }
        local_3e0 = &local_3d0;
        puVar18 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar18) {
          local_3d0 = *puVar18;
          uStack_3c8 = puVar10[3];
        }
        else {
          local_3d0 = *puVar18;
          local_3e0 = (ulong *)*puVar10;
        }
        local_3d8 = puVar10[1];
        *puVar10 = puVar18;
        puVar10[1] = 0;
        *(undefined1 *)puVar18 = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_3e0);
        local_438.m_data._0_8_ = &local_428;
        puVar18 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar18) {
          local_428 = *puVar18;
          lStack_420 = plVar11[3];
        }
        else {
          local_428 = *puVar18;
          local_438.m_data._0_8_ = (ulong *)*plVar11;
        }
        local_438.m_data._8_8_ = plVar11[1];
        *plVar11 = (long)puVar18;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
        std::ios_base::~ios_base(local_188);
        uVar17 = 0xf;
        if ((ulong *)local_438.m_data._0_8_ != &local_428) {
          uVar17 = local_428;
        }
        if (uVar17 < (ulong)(local_2d0 + local_438.m_data._8_8_)) {
          uVar17 = 0xf;
          if (local_2d8 != local_2c8) {
            uVar17 = local_2c8[0];
          }
          if (uVar17 < (ulong)(local_2d0 + local_438.m_data._8_8_)) goto LAB_00727088;
          pTVar9 = (TextureFormat *)
                   std::__cxx11::string::replace
                             ((ulong)&local_2d8,0,(char *)0x0,local_438.m_data._0_8_);
        }
        else {
LAB_00727088:
          pTVar9 = (TextureFormat *)
                   std::__cxx11::string::_M_append((char *)&local_438,(ulong)local_2d8);
        }
        local_410._0_8_ = &local_400;
        TVar13 = (TextureFormat)(pTVar9 + 2);
        if (*pTVar9 == TVar13) {
          local_400 = *(long *)TVar13;
          TStack_3f8 = pTVar9[3];
        }
        else {
          local_400 = *(long *)TVar13;
          local_410._0_8_ = *pTVar9;
        }
        unique0x00012000 = pTVar9[1];
        *pTVar9 = TVar13;
        pTVar9[1].order = R;
        pTVar9[1].type = SNORM_INT8;
        *(undefined1 *)TVar13 = 0;
        std::__cxx11::string::operator=((string *)&local_3a8,(string *)local_410);
        if ((long *)local_410._0_8_ != &local_400) {
          operator_delete((void *)local_410._0_8_,local_400 + 1);
        }
        if (local_2d8 != local_2c8) {
          operator_delete(local_2d8,local_2c8[0] + 1);
        }
        if ((ulong *)local_438.m_data._0_8_ != &local_428) {
          operator_delete((void *)local_438.m_data._0_8_,local_428 + 1);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0,local_3d0 + 1);
        }
        if (local_2b8 != local_2a8) {
          operator_delete(local_2b8,local_2a8[0] + 1);
        }
        uVar17 = local_348[0];
        puVar18 = local_358;
        if (local_358 != local_348) {
LAB_00727295:
          operator_delete(puVar18,uVar17 + 1);
        }
      }
      else {
        local_438.m_data._0_8_ = &local_428;
        if (IVar1 == IMAGE_TYPE_3D) {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_438,local_3a8,
                     (VkCommandBuffer)((long)&local_3a8->order + (long)local_1f8[0].m_format));
          std::__cxx11::string::append((char *)&local_438);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
          std::ios_base::~ios_base(local_188);
          uVar17 = 0xf;
          if ((ulong *)local_438.m_data._0_8_ != &local_428) {
            uVar17 = local_428;
          }
          if (uVar17 < (ulong)(local_3d8 + local_438.m_data._8_8_)) {
            uVar17 = 0xf;
            if (local_3e0 != &local_3d0) {
              uVar17 = local_3d0;
            }
            if ((ulong)(local_3d8 + local_438.m_data._8_8_) <= uVar17) {
              pTVar9 = (TextureFormat *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_3e0,0,(char *)0x0,local_438.m_data._0_8_);
              goto LAB_007271eb;
            }
          }
          pTVar9 = (TextureFormat *)
                   std::__cxx11::string::_M_append((char *)&local_438,(ulong)local_3e0);
        }
        else {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_438,local_3a8,
                     (VkCommandBuffer)((long)&local_3a8->order + (long)local_1f8[0].m_format));
          std::__cxx11::string::append((char *)&local_438);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
          std::ios_base::~ios_base(local_188);
          uVar17 = 0xf;
          if ((ulong *)local_438.m_data._0_8_ != &local_428) {
            uVar17 = local_428;
          }
          if (uVar17 < (ulong)(local_3d8 + local_438.m_data._8_8_)) {
            uVar17 = 0xf;
            if (local_3e0 != &local_3d0) {
              uVar17 = local_3d0;
            }
            if ((ulong)(local_3d8 + local_438.m_data._8_8_) <= uVar17) {
              pTVar9 = (TextureFormat *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_3e0,0,(char *)0x0,local_438.m_data._0_8_);
              goto LAB_007271eb;
            }
          }
          pTVar9 = (TextureFormat *)
                   std::__cxx11::string::_M_append((char *)&local_438,(ulong)local_3e0);
        }
LAB_007271eb:
        local_410._0_8_ = &local_400;
        TVar13 = (TextureFormat)(pTVar9 + 2);
        if (*pTVar9 == TVar13) {
          local_400 = *(long *)TVar13;
          TStack_3f8 = pTVar9[3];
        }
        else {
          local_400 = *(long *)TVar13;
          local_410._0_8_ = *pTVar9;
        }
        unique0x00012000 = pTVar9[1];
        *pTVar9 = TVar13;
        pTVar9[1].order = R;
        pTVar9[1].type = SNORM_INT8;
        *(undefined1 *)TVar13 = 0;
        std::__cxx11::string::operator=((string *)&local_3a8,(string *)local_410);
        if ((long *)local_410._0_8_ != &local_400) {
          operator_delete((void *)local_410._0_8_,local_400 + 1);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0,local_3d0 + 1);
        }
        uVar17 = local_428;
        puVar18 = (ulong *)local_438.m_data._0_8_;
        if ((ulong *)local_438.m_data._0_8_ != &local_428) goto LAB_00727295;
      }
      getLayerOrSlice(local_1f8,IVar1,&local_300,(deUint32)uVar15);
      getLayerOrSlice((ConstPixelBufferAccess *)local_410,IVar1,&local_58,(deUint32)uVar15);
      log = local_3b0->m_log;
      if ((char)local_3e8 == '\0') {
        lVar12 = 0;
        do {
          local_438.m_data[lVar12] = 0.01;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        bVar3 = tcu::floatThresholdCompare
                          (log,(char *)local_388._0_8_,(char *)local_3a8,local_1f8,
                           (ConstPixelBufferAccess *)local_410,&local_438,COMPARE_LOG_RESULT);
      }
      else {
        local_438.m_data._0_8_ = (ulong *)0x0;
        local_438.m_data[2] = 0.0;
        local_438.m_data[3] = 0.0;
        bVar3 = tcu::intThresholdCompare
                          (log,(char *)local_388._0_8_,(char *)local_3a8,local_1f8,
                           (ConstPixelBufferAccess *)local_410,(UVec4 *)&local_438,
                           COMPARE_LOG_RESULT);
      }
      if (local_3a8 != local_398) {
        operator_delete(local_3a8,(ulong)((long)local_398[0] + 1));
      }
      if ((long *)local_388._0_8_ != &local_378) {
        operator_delete((void *)local_388._0_8_,local_378 + 1);
      }
      dVar5 = getNumLayers(IVar1,local_3c0);
      dVar4 = dVar4 + bVar3;
      uVar15 = uVar15 + 1;
    } while (uVar15 < dVar5);
  }
  dVar5 = getNumLayers(IVar1,local_3c0);
  TVar13 = (TextureFormat)(local_1f8[0].m_size.m_data + 2);
  local_1f8[0].m_format = TVar13;
  if (dVar4 == dVar5) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"Passed","");
    pTVar16 = local_298;
    local_298->m_code = QP_TEST_RESULT_PASS;
    (local_298->m_description)._M_dataplus._M_p = (pointer)&(local_298->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298->m_description,local_1f8[0].m_format,
               (VkCommandBuffer)
               (CONCAT44(local_1f8[0].m_size.m_data[1],local_1f8[0].m_size.m_data[0]) +
               (long)local_1f8[0].m_format));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"Image comparison failed","");
    pTVar16 = local_298;
    local_298->m_code = QP_TEST_RESULT_FAIL;
    (local_298->m_description)._M_dataplus._M_p = (pointer)&(local_298->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298->m_description,local_1f8[0].m_format,
               (VkCommandBuffer)
               (CONCAT44(local_1f8[0].m_size.m_data[1],local_1f8[0].m_size.m_data[0]) +
               (long)local_1f8[0].m_format));
  }
  if (local_1f8[0].m_format != TVar13) {
    operator_delete((void *)local_1f8[0].m_format,
                    CONCAT44(local_1f8[0].m_pitch.m_data[0],local_1f8[0].m_size.m_data[2]) + 1);
  }
  tcu::TextureLevel::~TextureLevel(&local_80);
  if (local_328 != (TextureFormat)0x0) {
    local_1f8[0].m_format = local_328;
    (**(code **)(*plStack_320 + 0x240))(plStack_320,local_318,uStack_310,1);
  }
  if (local_258 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_250,(VkCommandPool)local_258);
  }
  if (local_238 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_230,(VkPipeline)local_238);
  }
  if (local_278 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_270,(VkPipelineLayout)local_278);
  }
  if (local_218 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&DStack_210,(VkShaderModule)local_218);
  }
  return pTVar16;
}

Assistant:

tcu::TestStatus	MemoryQualifierInstanceBase::iterate (void)
{
	const VkDevice			device				= m_context.getDevice();
	const DeviceInterface&	deviceInterface		= m_context.getDeviceInterface();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	const VkDeviceSize	bufferSizeInBytes = getNumPixels(m_imageType, m_imageSize) * tcu::getPixelSize(m_format);

	// Prepare resources for the test
	prepareResources(bufferSizeInBytes);

	// Prepare descriptor sets
	prepareDescriptors();

	// Create compute shader
	const vk::Unique<VkShaderModule> shaderModule(createShaderModule(deviceInterface, device, m_context.getBinaryCollection().get(m_name), 0u));

	// Create compute pipeline
	const vk::Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(deviceInterface, device, *m_descriptorSetLayout));
	const vk::Unique<VkPipeline> pipeline(makeComputePipeline(deviceInterface, device, *pipelineLayout, *shaderModule));

	// Create command buffer
	const Unique<VkCommandPool> cmdPool(createCommandPool(deviceInterface, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(deviceInterface, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands
	beginCommandBuffer(deviceInterface, *cmdBuffer);

	deviceInterface.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	deviceInterface.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);

	commandsBeforeCompute(*cmdBuffer, bufferSizeInBytes);

	const tcu::UVec3 numGroups = getNumWorkGroups(m_imageType, m_imageSize);
	deviceInterface.cmdDispatch(*cmdBuffer, numGroups.x(), numGroups.y(), numGroups.z());

	commandsAfterCompute(*cmdBuffer, bufferSizeInBytes);

	endCommandBuffer(deviceInterface, *cmdBuffer);

	// Submit and wait for completion
	submitCommandsAndWait(deviceInterface, device, queue, *cmdBuffer);

	// Retrieve data from buffer to host memory
	const Allocation& allocation = m_buffer->getAllocation();
	invalidateMappedMemoryRange(deviceInterface, device, allocation.getMemory(), allocation.getOffset(), bufferSizeInBytes);

	const tcu::UVec3 computeGridSize = getShaderGridSize(m_imageType, m_imageSize);
	tcu::ConstPixelBufferAccess resultPixelBuffer(m_format, computeGridSize.x(), computeGridSize.y(), computeGridSize.z(), allocation.getHostPtr());

	// Create a reference image
	tcu::TextureLevel referenceImage = generateReferenceImage();
	tcu::ConstPixelBufferAccess referencePixelBuffer = referenceImage.getAccess();

	// Validate the result
	if (comparePixelBuffers(m_context.getTestContext(), m_imageType, m_imageSize, m_format, referencePixelBuffer, resultPixelBuffer))
		return tcu::TestStatus::pass("Passed");
	else
		return tcu::TestStatus::fail("Image comparison failed");
}